

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O2

Vec_Int_t * Ga2_ManAbsDerive(Gia_Man_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar2;
  int iVar3;
  
  p_01 = Vec_IntAlloc(1000);
  iVar3 = 0;
  while ((iVar3 < p->nRegs &&
         (pGVar2 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar3), pGVar2 != (Gia_Obj_t *)0x0))) {
    if (*(long *)pGVar2 < 0) {
      p_00 = p->vGateClasses;
      iVar1 = Gia_ObjId(p,pGVar2);
      iVar1 = Vec_IntEntry(p_00,iVar1);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjId(p,pGVar2);
        Vec_IntPush(p_01,iVar1);
      }
    }
    iVar3 = iVar3 + 1;
  }
  iVar3 = 0;
  while ((iVar3 < p->nObjs && (pGVar2 = Gia_ManObj(p,iVar3), pGVar2 != (Gia_Obj_t *)0x0))) {
    iVar3 = iVar3 + 1;
  }
  return p_01;
}

Assistant:

Vec_Int_t * Ga2_ManAbsDerive( Gia_Man_t * p )
{
    Vec_Int_t * vToAdd;
    Gia_Obj_t * pObj;
    int i;
    vToAdd = Vec_IntAlloc( 1000 );
    Gia_ManForEachRo( p, pObj, i )
        if ( pObj->fPhase && Vec_IntEntry(p->vGateClasses, Gia_ObjId(p, pObj)) )
            Vec_IntPush( vToAdd, Gia_ObjId(p, pObj) );
    Gia_ManForEachAnd( p, pObj, i )
        if ( pObj->fPhase && Vec_IntEntry(p->vGateClasses, i) )
            Vec_IntPush( vToAdd, i );
    return vToAdd;
}